

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_ctx.h
# Opt level: O0

void __thiscall ScannerCtx::ScannerCtx(ScannerCtx *this)

{
  position local_20;
  ScannerCtx *local_10;
  ScannerCtx *this_local;
  
  this->isBracketArg = false;
  this->bracketsLength = 0;
  local_10 = this;
  StringLiteral::StringLiteral(&this->stringLiteral);
  yy::parser::symbol_type::symbol_type(&this->nextToken);
  yy::position::position(&local_20,(filename_type *)0x0,1,1);
  yy::location::location(&this->location,&local_20);
  std::__cxx11::string::string((string *)&this->filepath);
  return;
}

Assistant:

void SetInputFile(const std::string path)
    {
        filepath = path;
        location.initialize(&filepath);
    }